

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O1

bool __thiscall
binlog::SessionWriter::addEvent<std::array<int,5ul>>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,array<int,_5UL> *args)

{
  ulong minQueueCapacity;
  Queue *pQVar1;
  undefined8 uVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char *data;
  long lVar6;
  size_t sizes [3];
  long local_48 [3];
  
  local_48[0] = 8;
  local_48[1] = 8;
  local_48[2] = 0x18;
  lVar6 = 0;
  lVar3 = 0;
  do {
    lVar6 = lVar6 + *(long *)((long)local_48 + lVar3);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x18);
  minQueueCapacity = lVar6 + 4;
  if ((ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity) {
    sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw);
    if (((sVar4 < minQueueCapacity) &&
        (replaceChannel(this,minQueueCapacity),
        (ulong)((long)(this->_qw)._writeEnd - (long)(this->_qw)._writePos) < minQueueCapacity)) &&
       (sVar4 = detail::QueueWriter::maximizeWriteCapacity(&this->_qw), sVar4 < minQueueCapacity)) {
      return false;
    }
  }
  *(int *)(this->_qw)._writePos = (int)lVar6;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 4;
  *(uint64_t *)(pcVar5 + 4) = eventSourceId;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  *(uint64_t *)(pcVar5 + 8) = clock;
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 8;
  pcVar5[8] = '\x05';
  pcVar5[9] = '\0';
  pcVar5[10] = '\0';
  pcVar5[0xb] = '\0';
  pcVar5 = (this->_qw)._writePos;
  (this->_qw)._writePos = pcVar5 + 4;
  *(int *)(pcVar5 + 0x14) = args->_M_elems[4];
  uVar2 = *(undefined8 *)(args->_M_elems + 2);
  *(undefined8 *)(pcVar5 + 4) = *(undefined8 *)args->_M_elems;
  *(undefined8 *)(pcVar5 + 0xc) = uVar2;
  pQVar1 = (this->_qw)._queue;
  pcVar5 = (this->_qw)._writePos + 0x14;
  (this->_qw)._writePos = pcVar5;
  (pQVar1->writeIndex).super___atomic_base<unsigned_long>._M_i = (long)pcVar5 - (long)pQVar1->buffer
  ;
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}